

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O2

size_t anurbs::HilbertCurve<3L>::d(size_t i)

{
  size_t sVar1;
  
  if (i != 0) {
    sVar1 = g((i + ((uint)i & 1)) - 1);
    return sVar1 % 3;
  }
  return 0;
}

Assistant:

static size_t d(const size_t i) noexcept
    {
        if (i == 0) {
            return 0;
        } else if (i % 2 == 0) {
            return g(i - 1) % TDimension;
        } else {
            return g(i) % TDimension;
        }
    }